

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_ident_free(lysf_ctx *ctx,lysp_ident *ident)

{
  lysp_qname *plVar1;
  char **ppcVar2;
  lysp_ext_instance *plVar3;
  ulong uVar4;
  char *pcVar5;
  lysp_ext_instance *plVar6;
  uint64_t c__;
  ulong uVar7;
  lysp_ext_instance *plVar8;
  uint64_t c___1;
  long lVar9;
  char *pcVar10;
  
  lydict_remove(ctx->ctx,ident->name);
  lVar9 = 0;
  uVar7 = 0;
  while( true ) {
    plVar1 = ident->iffeatures;
    if (plVar1 == (lysp_qname *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar4 <= uVar7) break;
    if (plVar1 != (lysp_qname *)0x0) {
      lydict_remove(ctx->ctx,*(char **)((long)&plVar1->str + lVar9));
    }
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 0x18;
  }
  if (plVar1 != (lysp_qname *)0x0) {
    free(&plVar1[-1].flags);
  }
  pcVar10 = (char *)0x0;
  while( true ) {
    ppcVar2 = ident->bases;
    if (ppcVar2 == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = ppcVar2[-1];
    }
    if (pcVar5 <= pcVar10) break;
    lydict_remove(ctx->ctx,ppcVar2[(long)pcVar10]);
    pcVar10 = pcVar10 + 1;
  }
  if (ppcVar2 != (char **)0x0) {
    free(ppcVar2 + -1);
  }
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  lVar9 = 0;
  plVar8 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar3 = ident->exts;
    if (plVar3 == (lysp_ext_instance *)0x0) {
      plVar6 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar6 = plVar3[-1].exts;
    }
    if (plVar6 <= plVar8) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar9));
    plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
    lVar9 = lVar9 + 0x70;
  }
  if (plVar3 != (lysp_ext_instance *)0x0) {
    free(&plVar3[-1].exts);
    return;
  }
  return;
}

Assistant:

static void
lysp_ident_free(struct lysf_ctx *ctx, struct lysp_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    FREE_ARRAY(ctx->ctx, ident->iffeatures, lysp_qname_free);
    FREE_STRINGS(ctx->ctx, ident->bases);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    FREE_ARRAY(ctx, ident->exts, lysp_ext_instance_free);
}